

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int uv_pipe_bind(uv_pipe_t *handle,char *name)

{
  int iVar1;
  char *__src;
  int *piVar2;
  char *in_RSI;
  long in_RDI;
  int err;
  int bound;
  int sockfd;
  char *pipe_fname;
  sockaddr_un saddr;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  sockaddr local_86 [6];
  undefined1 local_19;
  char *local_18;
  long local_10;
  int local_4;
  
  if (*(int *)(in_RDI + 0xa0) < 0) {
    local_18 = in_RSI;
    local_10 = in_RDI;
    __src = strdup(in_RSI);
    if (__src == (char *)0x0) {
      local_4 = -0xc;
    }
    else {
      local_18 = (char *)0x0;
      local_4 = uv__socket(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                           in_stack_ffffffffffffff58);
      if (-1 < local_4) {
        memset(local_86,0,0x6e);
        strncpy(local_86[0].sa_data,__src,0x6b);
        local_19 = 0;
        local_86[0].sa_family = 1;
        iVar1 = bind(local_4,local_86,0x6e);
        if (iVar1 == 0) {
          *(char **)(local_10 + 0xe0) = __src;
          *(int *)(local_10 + 0xa0) = local_4;
          return 0;
        }
        piVar2 = __errno_location();
        local_4 = -*piVar2;
        if (local_4 == -2) {
          local_4 = -0xd;
        }
      }
    }
    uv__close(local_4);
    free(__src);
  }
  else {
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int uv_pipe_bind(uv_pipe_t* handle, const char* name) {
  struct sockaddr_un saddr;
  const char* pipe_fname;
  int sockfd;
  int bound;
  int err;

  pipe_fname = NULL;
  sockfd = -1;
  bound = 0;
  err = -EINVAL;

  /* Already bound? */
  if (uv__stream_fd(handle) >= 0)
    return -EINVAL;

  /* Make a copy of the file name, it outlives this function's scope. */
  pipe_fname = strdup(name);
  if (pipe_fname == NULL) {
    err = -ENOMEM;
    goto out;
  }

  /* We've got a copy, don't touch the original any more. */
  name = NULL;

  err = uv__socket(AF_UNIX, SOCK_STREAM, 0);
  if (err < 0)
    goto out;
  sockfd = err;

  memset(&saddr, 0, sizeof saddr);
  strncpy(saddr.sun_path, pipe_fname, sizeof(saddr.sun_path) - 1);
  saddr.sun_path[sizeof(saddr.sun_path) - 1] = '\0';
  saddr.sun_family = AF_UNIX;

  if (bind(sockfd, (struct sockaddr*)&saddr, sizeof saddr)) {
    err = -errno;
    /* Convert ENOENT to EACCES for compatibility with Windows. */
    if (err == -ENOENT)
      err = -EACCES;
    goto out;
  }
  bound = 1;

  /* Success. */
  handle->pipe_fname = pipe_fname; /* Is a strdup'ed copy. */
  handle->io_watcher.fd = sockfd;
  return 0;

out:
  if (bound) {
    /* unlink() before uv__close() to avoid races. */
    assert(pipe_fname != NULL);
    unlink(pipe_fname);
  }
  uv__close(sockfd);
  free((void*)pipe_fname);
  return err;
}